

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  BaseType BVar1;
  Type *this_00;
  int64_t iVar2;
  allocator<char> *__a;
  char *__s;
  double t;
  allocator<char> local_12;
  allocator<char> local_11;
  
  this_00 = reflection::Field::type((Field *)this);
  BVar1 = reflection::Type::base_type(this_00);
  if (BVar1 - Float < 2) {
    t = reflection::Field::default_real((Field *)this);
    NumToString<double>(__return_storage_ptr__,t);
  }
  else {
    if (BVar1 == Bool) {
      iVar2 = reflection::Field::default_integer((Field *)this);
      __s = "true";
      if (iVar2 == 0) {
        __s = "false";
      }
      __a = &local_11;
    }
    else {
      if (BVar1 - UType < 0xc) {
        iVar2 = reflection::Field::default_integer((Field *)this);
        NumToString<long>(__return_storage_ptr__,iVar2);
        return __return_storage_ptr__;
      }
      __s = "0";
      __a = &local_12;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsFloatingPoint(base_type)) {
      return NumToString(field->default_real());
    }
    if (IsBool(base_type)) {
      return field->default_integer() ? "true" : "false";
    }
    if (IsScalar(base_type)) { return NumToString((field->default_integer())); }
    // represents offsets
    return "0";
  }